

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall
testing::internal::anon_unknown_38::UnitTestFilter::MatchesName(UnitTestFilter *this,string *name)

{
  pointer pbVar1;
  _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
  *this_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  bool bVar2;
  const_iterator cVar3;
  ulong uVar4;
  long lVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pbVar8;
  
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->exact_match_patterns_)._M_h,name);
  if (cVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return true;
  }
  pbVar6 = (this->glob_patterns_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->glob_patterns_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
             *)(name->_M_dataplus)._M_p;
  __it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name->_M_string_length;
  uVar4 = (long)pbVar1 - (long)pbVar6;
  if (0 < (long)uVar4 >> 7) {
    pbVar8 = (pointer)((long)&(pbVar6->_M_dataplus)._M_p + (uVar4 & 0xffffffffffffff80));
    lVar5 = ((long)uVar4 >> 7) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()(this_00,__it);
      pbVar7 = pbVar6;
      if (bVar2) goto LAB_00138283;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()(this_00,__it);
      pbVar7 = pbVar6 + 1;
      if (bVar2) goto LAB_00138283;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()(this_00,__it);
      pbVar7 = pbVar6 + 2;
      if (bVar2) goto LAB_00138283;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()(this_00,__it);
      pbVar7 = pbVar6 + 3;
      if (bVar2) goto LAB_00138283;
      pbVar6 = pbVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
    uVar4 = (long)pbVar1 - (long)pbVar8;
    pbVar6 = pbVar8;
  }
  lVar5 = (long)uVar4 >> 5;
  if (lVar5 != 1) {
    pbVar7 = pbVar6;
    if (lVar5 != 2) {
      pbVar7 = pbVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
                  ::operator()(this_00,__it), pbVar7 = pbVar6, bVar2)) goto LAB_00138283;
      pbVar7 = pbVar6 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()(this_00,__it);
    if (bVar2) goto LAB_00138283;
    pbVar6 = pbVar7 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
          ::operator()(this_00,__it);
  pbVar7 = pbVar6;
  if (!bVar2) {
    pbVar7 = pbVar1;
  }
LAB_00138283:
  return pbVar7 != pbVar1;
}

Assistant:

bool MatchesName(const std::string& name) const {
    return exact_match_patterns_.count(name) > 0 ||
           std::any_of(glob_patterns_.begin(), glob_patterns_.end(),
                       [&name](const std::string& pattern) {
                         return PatternMatchesString(
                             name, pattern.c_str(),
                             pattern.c_str() + pattern.size());
                       });
  }